

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Embed *value)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  pointer pFVar2;
  pointer pcVar3;
  Type TVar4;
  bool bVar5;
  ssize_t sVar6;
  size_t in_RCX;
  size_t __n;
  void *in_RDX;
  void *__buf;
  char *msg;
  long lVar7;
  pointer pFVar8;
  
  BinaryWriter::write(&this->writer,(int)value,in_RDX,in_RCX);
  pvVar1 = (this->writer).buffer_;
  lVar7 = (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  BinaryWriter::write<unsigned_int>(&this->writer,0);
  __n = 0x70;
  BinaryWriter::write<unsigned_short>
            (&this->writer,
             (unsigned_short)
             (((long)(value->items).
                     super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(value->items).
                    super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x70));
  pFVar8 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pFVar8 == pFVar2) {
      pvVar1 = (this->writer).buffer_;
      pcVar3 = (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(int *)(pcVar3 + lVar7) =
           (*(int *)&(pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish - ((int)lVar7 + (int)pcVar3)) + -4;
      return true;
    }
    BinaryWriter::write<unsigned_int>(&this->writer,(pFVar8->key).hash_);
    TVar4 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
            ::value_to_type(&pFVar8->value);
    sVar6 = BinaryWriter::write(&this->writer,(uint)TVar4,__buf,__n);
    if ((char)sVar6 == '\0') break;
    bVar5 = write_value(this,&pFVar8->value);
    pFVar8 = pFVar8 + 1;
    if (!bVar5) {
      msg = "write_value(item)\n";
LAB_001124ea:
      bVar5 = fail_msg(this,msg);
      return bVar5;
    }
  }
  msg = "writer.write(ValueHelper::value_to_type(item))\n";
  goto LAB_001124ea;
}

Assistant:

bool write_value_visit(Embed const& value) noexcept {
            writer.write(value.name);
            size_t position = writer.position();
            writer.write(uint32_t{ 0 });
            writer.write(static_cast<uint16_t>(value.items.size()));
            for (auto const& [name, item] : value.items) {
                writer.write(name.hash());
                bin_assert(writer.write(ValueHelper::value_to_type(item)));
                bin_assert(write_value(item));
            }
            writer.write_at(position, writer.position() - position - 4);
            return true;
        }